

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O1

int b64_ntop(uchar *src,size_t srclength,char *target,size_t targsize)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  size_t sVar5;
  char cVar6;
  ulong uVar7;
  ulong uVar8;
  byte local_33 [3];
  
  if (srclength < 3) {
    uVar7 = 0;
  }
  else {
    uVar8 = 0;
    do {
      bVar1 = *src;
      bVar2 = src[1];
      bVar3 = src[2];
      uVar7 = uVar8 + 4;
      if (targsize < uVar7) {
        return -1;
      }
      srclength = srclength - 3;
      src = src + 3;
      target[uVar8] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar1 >> 2]
      ;
      target[uVar8 + 1] =
           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
           [(byte)((bVar1 & 3) << 4 | bVar2 >> 4)];
      target[uVar8 + 2] =
           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
           [(byte)(bVar2 * '\x04' & 0x3f | bVar3 >> 6)];
      target[uVar8 + 3] =
           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar3 & 0x3f];
      uVar8 = uVar7;
    } while (2 < srclength);
  }
  if (srclength != 0) {
    local_33[2] = 0;
    local_33[0] = 0;
    local_33[1] = 0;
    sVar5 = 0;
    do {
      local_33[sVar5] = src[sVar5];
      sVar5 = sVar5 + 1;
    } while (srclength != sVar5);
    if (targsize < uVar7 + 4) {
      return -1;
    }
    target[uVar7] =
         "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[local_33[0] >> 2];
    target[uVar7 + 1] =
         "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
         [(local_33[0] & 3) << 4 | (uint)(local_33[1] >> 4)];
    cVar6 = '=';
    if (srclength != 1) {
      cVar6 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
              [(uint)(local_33[2] >> 6) + (local_33[1] & 0xf) * 4];
    }
    target[uVar7 | 2] = cVar6;
    target[uVar7 + 3] = '=';
    uVar7 = uVar7 + 4;
  }
  iVar4 = -1;
  if (uVar7 < targsize) {
    target[uVar7] = '\0';
    iVar4 = (int)uVar7;
  }
  return iVar4;
}

Assistant:

int
b64_ntop(unsigned char const *src, size_t srclength, char *target, size_t targsize) {
	size_t datalength = 0;
	unsigned char input[3];
	unsigned char output[4];
	size_t i;

	while (2 < srclength) {
		input[0] = *src++;
		input[1] = *src++;
		input[2] = *src++;
		srclength -= 3;

		output[0] = input[0] >> 2;
		output[1] = ((input[0] & 0x03) << 4) + (input[1] >> 4);
		output[2] = ((input[1] & 0x0f) << 2) + (input[2] >> 6);
		output[3] = input[2] & 0x3f;
		Assert(output[0] < 64);
		Assert(output[1] < 64);
		Assert(output[2] < 64);
		Assert(output[3] < 64);

		if (datalength + 4 > targsize)
			return (-1);
		target[datalength++] = Base64[output[0]];
		target[datalength++] = Base64[output[1]];
		target[datalength++] = Base64[output[2]];
		target[datalength++] = Base64[output[3]];
	}

	/* Now we worry about padding. */
	if (0 != srclength) {
		/* Get what's left. */
		input[0] = input[1] = input[2] = '\0';
		for (i = 0; i < srclength; i++)
			input[i] = *src++;
	
		output[0] = input[0] >> 2;
		output[1] = ((input[0] & 0x03) << 4) + (input[1] >> 4);
		output[2] = ((input[1] & 0x0f) << 2) + (input[2] >> 6);
		Assert(output[0] < 64);
		Assert(output[1] < 64);
		Assert(output[2] < 64);

		if (datalength + 4 > targsize)
			return (-1);
		target[datalength++] = Base64[output[0]];
		target[datalength++] = Base64[output[1]];
		if (srclength == 1)
			target[datalength++] = Pad64;
		else
			target[datalength++] = Base64[output[2]];
		target[datalength++] = Pad64;
	}
	if (datalength >= targsize)
		return (-1);
	target[datalength] = '\0';	/* Returned value doesn't count \0. */
	return (datalength);
}